

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O0

bool __thiscall
JsonModelSerialiserPrivate::roleForObject
          (JsonModelSerialiserPrivate *this,QJsonObject *source,QModelIndex *destination)

{
  QAbstractItemModel *pQVar1;
  int type;
  bool bVar2;
  byte bVar3;
  QString local_f8;
  QVariant local_e0;
  QLatin1String local_c0;
  QJsonValue local_b0 [28];
  int local_94;
  undefined1 auStack_90 [4];
  int tempType;
  QJsonValue local_80 [28];
  undefined4 local_64;
  undefined4 local_60;
  int tempRole;
  QLatin1String local_50;
  QJsonValue local_40 [8];
  QJsonValue tempValue;
  QModelIndex *destination_local;
  QJsonObject *source_local;
  JsonModelSerialiserPrivate *this_local;
  
  QLatin1String::QLatin1String(&local_50,"role");
  QJsonObject::value((QLatin1String *)local_40);
  bVar2 = QJsonValue::isUndefined(local_40);
  if ((bVar2) || (bVar2 = QJsonValue::isDouble(local_40), !bVar2)) {
    this_local._7_1_ = false;
  }
  else {
    local_64 = QJsonValue::toInt((int)local_40);
    QLatin1String::QLatin1String((QLatin1String *)auStack_90,"type");
    QJsonObject::value((QLatin1String *)local_80);
    QJsonValue::operator=(local_40,local_80);
    QJsonValue::~QJsonValue(local_80);
    bVar2 = QJsonValue::isUndefined(local_40);
    if ((bVar2) || (bVar2 = QJsonValue::isDouble(local_40), !bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      local_94 = QJsonValue::toInt((int)local_40);
      QLatin1String::QLatin1String(&local_c0,"value");
      QJsonObject::value((QLatin1String *)local_b0);
      QJsonValue::operator=(local_40,local_b0);
      QJsonValue::~QJsonValue(local_b0);
      bVar2 = QJsonValue::isUndefined(local_40);
      if ((bVar2) || (bVar2 = QJsonValue::isString(local_40), type = local_94, !bVar2)) {
        this_local._7_1_ = false;
      }
      else {
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_model;
        QJsonValue::toString();
        AbstractStringSerialiserPrivate::loadVariant
                  (&local_e0,&this->super_AbstractStringSerialiserPrivate,type,&local_f8);
        bVar3 = (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,destination,&local_e0,local_64);
        ::QVariant::~QVariant(&local_e0);
        QString::~QString(&local_f8);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  local_60 = 1;
  QJsonValue::~QJsonValue(local_40);
  return this_local._7_1_;
}

Assistant:

bool JsonModelSerialiserPrivate::roleForObject(const QJsonObject &source, const QModelIndex &destination)
{
    QJsonValue tempValue = source.value(QLatin1String("role"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempRole =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("type"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempType =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("value"));
    if (tempValue.isUndefined() || !tempValue.isString())
        return false;
    if (!m_model->setData(destination, loadVariant(tempType, tempValue.toString()), tempRole))
        return false;
    return true;
}